

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onBeforeRet(RACFGBuilder *this,FuncRetNode *funcRet)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  BaseBuilder *pBVar4;
  Environment vReg;
  bool bVar5;
  uint uVar6;
  Error EVar7;
  uint uVar8;
  undefined8 extraout_RAX;
  Error unaff_EBP;
  InstId IVar9;
  long lVar10;
  RAWorkReg *workReg;
  Reg src;
  Operand_ local_58;
  RAWorkReg *local_48;
  Operand_ local_40;
  
  lVar3 = *(long *)(*(long *)this + 0x98);
  bVar1 = funcRet->field_0x12;
  *(undefined8 *)(*(long *)(this + 8) + 0x198) = *(undefined8 *)funcRet;
  if (bVar1 != 0) {
    lVar10 = 0;
    do {
      if (lVar10 == 0x10) {
        onBeforeRet();
        __clang_call_terminate(extraout_RAX);
      }
      bVar5 = false;
      EVar7 = unaff_EBP;
      if ((((*(uint *)(&funcRet->field_0x40 + lVar10 * 4) & 7) == 1) &&
          (bVar5 = false, *(char *)(lVar3 + 0xc3 + lVar10) == '\x16')) &&
         (uVar6 = *(int *)(&funcRet->field_0x44 + lVar10 * 4) - 0x100, uVar6 < 0xfffffeff)) {
        pBVar4 = ((*(BaseRAPass **)this)->super_FuncPass).super_Pass._cb;
        if (uVar6 < *(uint *)&pBVar4[1].super_BaseEmitter._logger) {
          vReg = (&(pBVar4[1].super_BaseEmitter._code)->_environment)[uVar6];
          local_48 = *(RAWorkReg **)((long)vReg + 0x28);
          EVar7 = 0;
          if (local_48 == (RAWorkReg *)0x0) {
            EVar7 = BaseRAPass::_asWorkReg(*(BaseRAPass **)this,(VirtReg *)vReg,&local_48);
          }
        }
        else {
          EVar7 = 0x1e;
        }
        bVar5 = true;
        if (EVar7 == 0) {
          uVar6 = *(uint *)(local_48 + 0x20);
          EVar7 = 0x19;
          if ((uVar6 & 0xf00) == 0x100) {
            local_40._baseId = *(uint32_t *)(local_48 + 4);
            local_40._data[0] = 0;
            local_40._data[1] = 0;
            local_58._signature._bits = 2;
            local_58._baseId = 0;
            local_58._data[0] = 0;
            local_58._data[1] = 0;
            uVar2 = *(uint *)(lVar3 + 0xc0 + lVar10);
            uVar8 = (uint)(byte)TypeUtils::_typeData[*(byte *)(*(long *)(local_48 + 8) + 0xd)];
            if ((char)uVar2 != '\0') {
              uVar8 = uVar2;
            }
            local_40._signature._bits = uVar6;
            if ((char)uVar8 == '+') {
              EVar7 = BaseRAPass::useTemporaryMem(*(BaseRAPass **)this,(BaseMem *)&local_58,8,4);
              if (EVar7 == 0) {
                local_58._signature._bits._3_1_ = 8;
                IVar9 = 0x4c1;
                if (this[0x292] == (RACFGBuilder)0x0) {
                  IVar9 = 0x1d6;
                }
                EVar7 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),IVar9,&local_58,&local_40);
                if (EVar7 == 0) {
                  EVar7 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0xe2,&local_58);
                  goto LAB_0014b336;
                }
              }
            }
            else {
              EVar7 = 0x19;
              if (((uVar8 & 0xff) == 0x2a) &&
                 (EVar7 = BaseRAPass::useTemporaryMem(*(BaseRAPass **)this,(BaseMem *)&local_58,4,4)
                 , EVar7 == 0)) {
                local_58._signature._bits._3_1_ = 4;
                IVar9 = 0x4c5;
                if (this[0x292] == (RACFGBuilder)0x0) {
                  IVar9 = 0x1d9;
                }
                EVar7 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),IVar9,&local_58,&local_40);
                if (EVar7 == 0) {
                  EVar7 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0xe2,&local_58);
LAB_0014b336:
                  if (EVar7 == 0) {
                    bVar5 = false;
                    EVar7 = unaff_EBP;
                  }
                }
              }
            }
          }
        }
      }
      unaff_EBP = EVar7;
      if (bVar5) {
        return unaff_EBP;
      }
      lVar10 = lVar10 + 4;
    } while ((ulong)bVar1 * 4 != lVar10);
  }
  return 0;
}

Assistant:

Error RACFGBuilder::onBeforeRet(FuncRetNode* funcRet) noexcept {
  const FuncDetail& funcDetail = _pass->func()->detail();
  const Operand* opArray = funcRet->operands();
  uint32_t opCount = funcRet->opCount();

  cc()->_setCursor(funcRet->prev());

  for (uint32_t i = 0; i < opCount; i++) {
    const Operand& op = opArray[i];
    const FuncValue& ret = funcDetail.ret(i);

    if (!op.isReg())
      continue;

    if (ret.regType() == RegType::kX86_St) {
      const Reg& reg = op.as<Reg>();
      uint32_t vIndex = Operand::virtIdToIndex(reg.id());

      if (vIndex < Operand::kVirtIdCount) {
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

        if (workReg->group() != RegGroup::kVec)
          return DebugUtils::errored(kErrorInvalidAssignment);

        Reg src(workReg->signature(), workReg->virtId());
        Mem mem;

        TypeId typeId = TypeUtils::scalarOf(workReg->typeId());
        if (ret.hasTypeId())
          typeId = ret.typeId();

        switch (typeId) {
          case TypeId::kFloat32:
            ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 4, 4));
            mem.setSize(4);
            ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovss, Inst::kIdVmovss), mem, src.as<Xmm>()));
            ASMJIT_PROPAGATE(cc()->fld(mem));
            break;

          case TypeId::kFloat64:
            ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 8, 4));
            mem.setSize(8);
            ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovsd, Inst::kIdVmovsd), mem, src.as<Xmm>()));
            ASMJIT_PROPAGATE(cc()->fld(mem));
            break;

          default:
            return DebugUtils::errored(kErrorInvalidAssignment);
        }
      }
    }
  }

  return kErrorOk;
}